

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegExp.cc
# Opt level: O2

void __thiscall flow::util::RegExp::RegExp(RegExp *this,string *pattern)

{
  std::__cxx11::string::string((string *)this,(string *)pattern);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&this->re_,pattern,0x10);
  return;
}

Assistant:

RegExp::RegExp(const std::string& pattern)
    : pattern_(pattern), re_(pattern) {
}